

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraBddMove(DdManager *dd,DdNode *bF,DdNode *bDist)

{
  DdNode *pDVar1;
  DdNode *g;
  int local_5c;
  int VarNew;
  DdNode *bFR;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bRes;
  DdNode *bDist_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)bF;
  if ((*(int *)((ulong)bF & 0xfffffffffffffffe) != 0x7fffffff) &&
     (dd_local = (DdManager *)cuddCacheLookup2(dd,extraBddMove,bF,bDist),
     dd_local == (DdManager *)0x0)) {
    pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
    if (((ulong)bDist & 1) == 0) {
      local_5c = pDVar1->index + bDist->index;
    }
    else {
      local_5c = pDVar1->index - *(int *)((ulong)bDist ^ 1);
    }
    if (dd->size <= local_5c) {
      __assert_fail("VarNew < dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                    ,0x47f,"DdNode *extraBddMove(DdManager *, DdNode *, DdNode *)");
    }
    if (pDVar1 == bF) {
      bF1 = (pDVar1->type).kids.E;
      bFR = (pDVar1->type).kids.T;
    }
    else {
      bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
      bFR = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
    }
    pDVar1 = extraBddMove(dd,bF1,bDist);
    if (pDVar1 == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      g = extraBddMove(dd,bFR,bDist);
      if (g == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar1);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
        dd_local = (DdManager *)cuddBddIteRecur(dd,dd->vars[local_5c],g,pDVar1);
        if (dd_local == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar1);
          Cudd_RecursiveDeref(dd,g);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar1);
          Cudd_RecursiveDeref(dd,g);
          cuddCacheInsert2(dd,extraBddMove,bF,bDist,(DdNode *)dd_local);
          *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddMove( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,
  DdNode * bDist) 
{
    DdNode * bRes;

    if ( Cudd_IsConstant(bF) )
        return bF;

    if ( (bRes = cuddCacheLookup2(dd, extraBddMove, bF, bDist)) )
        return bRes;
    else
    {
        DdNode * bRes0, * bRes1;             
        DdNode * bF0, * bF1;             
        DdNode * bFR = Cudd_Regular(bF); 
        int VarNew;
        
        if ( Cudd_IsComplement(bDist) )
            VarNew = bFR->index - Cudd_Not(bDist)->index;
        else
            VarNew = bFR->index + bDist->index;
        assert( VarNew < dd->size );

        // cofactor the functions
        if ( bFR != bF ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        bRes0 = extraBddMove( dd, bF0, bDist );
        if ( bRes0 == NULL ) 
            return NULL;
        cuddRef( bRes0 );

        bRes1 = extraBddMove( dd, bF1, bDist );
        if ( bRes1 == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bRes1 );

        /* only bRes0 and bRes1 are referenced at this point */
        bRes = cuddBddIteRecur( dd, dd->vars[VarNew], bRes1, bRes0 );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bRes1 );
            return NULL;
        }
        cuddRef( bRes );
        Cudd_RecursiveDeref( dd, bRes0 );
        Cudd_RecursiveDeref( dd, bRes1 );

        /* insert the result into cache */
        cuddCacheInsert2( dd, extraBddMove, bF, bDist, bRes );
        cuddDeref( bRes );
        return bRes;
    }
}